

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# response.c
# Opt level: O0

action_value action_type(char *action_spec)

{
  int iVar1;
  char *in_RDI;
  action_value local_4;
  
  if (in_RDI == (char *)0x0) {
    local_4 = Action_Split;
  }
  else {
    iVar1 = strncmp(in_RDI,"Bridge Action",0xd);
    if (iVar1 == 0) {
      local_4 = Action_Bridge;
    }
    else {
      iVar1 = strncmp(in_RDI,"Filter Action",0xd);
      if (iVar1 == 0) {
        local_4 = Action_Immediate;
      }
      else {
        iVar1 = strncmp(in_RDI,"Router Action",0xd);
        if (iVar1 == 0) {
          local_4 = Action_Immediate;
        }
        else {
          iVar1 = strncmp(in_RDI,"Transform Action",0x10);
          if (iVar1 == 0) {
            local_4 = Action_Immediate;
          }
          else {
            iVar1 = strncmp(in_RDI,"Multityped Action",0x11);
            if (iVar1 == 0) {
              local_4 = Action_Multi;
            }
            else {
              iVar1 = strncmp(in_RDI,"sink:",5);
              if (iVar1 == 0) {
                local_4 = Action_Terminal;
              }
              else {
                iVar1 = strncmp(in_RDI,"source:",7);
                if (iVar1 == 0) {
                  local_4 = Action_Source;
                }
                else {
                  iVar1 = strncmp(in_RDI,"Split Action",7);
                  if (iVar1 == 0) {
                    local_4 = Action_Split;
                  }
                  else {
                    local_4 = Action_NoAction;
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return local_4;
}

Assistant:

action_value
action_type(char *action_spec)
{
    if (action_spec == NULL)
	return Action_Split;
    if (strncmp(action_spec, "Bridge Action", 13) == 0)
	return Action_Bridge;
    if (strncmp(action_spec, "Filter Action", 13) == 0)
	return Action_Immediate;
    if (strncmp(action_spec, "Router Action", 13) == 0)
	return Action_Immediate;
    if (strncmp(action_spec, "Transform Action", 16) == 0)
	return Action_Immediate;
    if (strncmp(action_spec, "Multityped Action", 17) == 0)
	return Action_Multi;
    if (strncmp(action_spec, "sink:", 5) == 0)
	return Action_Terminal;
    if (strncmp(action_spec, "source:", 7) == 0)
	return Action_Source;
    if (strncmp(action_spec, "Split Action", 7) == 0)
	return Action_Split;
    return Action_NoAction;
}